

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode writeNamespaces(void *handle,UA_NodeId nodeid,UA_Variant *data,UA_NumericRange *range)

{
  void *pvVar1;
  ulong uVar2;
  UA_Boolean UVar3;
  ulong local_50;
  size_t i_1;
  size_t i;
  size_t newNamespacesSize;
  UA_String *newNamespaces;
  UA_Server *server;
  UA_NumericRange *range_local;
  UA_Variant *data_local;
  void *handle_local;
  
  if (data->type == (UA_DataType *)0x160590) {
    if (data->data == (void *)0x0) {
      handle_local._4_4_ = 0x80740000;
    }
    else if (range == (UA_NumericRange *)0x0) {
      pvVar1 = data->data;
      uVar2 = data->arrayLength;
      if (*(ulong *)((long)handle + 0x58) < uVar2) {
        for (i_1 = 0; i_1 < *(ulong *)((long)handle + 0x58); i_1 = i_1 + 1) {
          UVar3 = UA_String_equal((UA_String *)(*(long *)((long)handle + 0x60) + i_1 * 0x10),
                                  (UA_String *)((long)pvVar1 + i_1 * 0x10));
          if (!UVar3) {
            return 0x80020000;
          }
        }
        for (local_50 = *(ulong *)((long)handle + 0x58); local_50 < uVar2; local_50 = local_50 + 1)
        {
          addNamespace((UA_Server *)handle,*(UA_String *)((long)pvVar1 + local_50 * 0x10));
        }
        handle_local._4_4_ = 0;
      }
      else {
        handle_local._4_4_ = 0x80740000;
      }
    }
    else {
      handle_local._4_4_ = 0x80020000;
    }
  }
  else {
    handle_local._4_4_ = 0x80740000;
  }
  return handle_local._4_4_;
}

Assistant:

static UA_StatusCode
writeNamespaces(void *handle, const UA_NodeId nodeid, const UA_Variant *data,
                const UA_NumericRange *range) {
    UA_Server *server = (UA_Server*)handle;

    /* Check the data type */
    if(data->type != &UA_TYPES[UA_TYPES_STRING])
        return UA_STATUSCODE_BADTYPEMISMATCH;

    /* Check that the variant is not empty */
    if(!data->data)
        return UA_STATUSCODE_BADTYPEMISMATCH;

    /* TODO: Writing with a range is not implemented */
    if(range)
        return UA_STATUSCODE_BADINTERNALERROR;

    UA_String *newNamespaces = data->data;
    size_t newNamespacesSize = data->arrayLength;

    /* Test if we append to the existing namespaces */
    if(newNamespacesSize <= server->namespacesSize)
        return UA_STATUSCODE_BADTYPEMISMATCH;

    /* Test if the existing namespaces are unchanged */
    for(size_t i = 0; i < server->namespacesSize; ++i) {
        if(!UA_String_equal(&server->namespaces[i], &newNamespaces[i]))
            return UA_STATUSCODE_BADINTERNALERROR;
    }

    /* Add namespaces */
    for(size_t i = server->namespacesSize; i < newNamespacesSize; ++i)
        addNamespace(server, newNamespaces[i]);
    return UA_STATUSCODE_GOOD;
}